

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

bool __thiscall
gss::innards::HomomorphismModel::_check_degree_compatibility
          (HomomorphismModel *this,int p,int t,uint graphs_to_consider,
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *patterns_ndss,
          vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
          *targets_ndss,bool do_not_do_nds_yet)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  Proof *pPVar2;
  undefined8 uVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  optional<std::vector<int,std::allocator<int>>> *this_00;
  bool bVar13;
  uint j;
  uint uVar14;
  size_type __n;
  uint uVar15;
  int iVar16;
  long lVar17;
  ulong __n_00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  size_type __n_01;
  pointer ppVar18;
  vector<int,_std::allocator<int>_> n_t;
  vector<int,_std::allocator<int>_> n_p;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_nds;
  undefined1 local_1d0 [40];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_nds;
  undefined1 local_180 [40];
  vector<int,_std::allocator<int>_> t_remaining;
  SVOBitset nt;
  SVOBitset np;
  
  bVar6 = degree_and_nds_are_preserved
                    (((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->params);
  bVar13 = true;
  if (bVar6) {
    __n = (size_type)p;
    __n_01 = (size_type)t;
    uVar15 = 0;
LAB_001253f7:
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if (graphs_to_consider == uVar15) {
      if (!do_not_do_nds_yet && *(char *)((long)(_Var1._M_head_impl)->params + 0x8a) == '\0') {
        pvVar7 = std::
                 vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                 ::at(targets_ndss,0);
        pvVar8 = std::
                 vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                 ::at(pvVar7,__n_01);
        sVar9 = 0;
        if ((pvVar8->super__Optional_base<std::vector<int,_std::allocator<int>_>,_false,_false>).
            _M_payload.
            super__Optional_payload<std::vector<int,_std::allocator<int>_>,_true,_false,_false>.
            super__Optional_payload_base<std::vector<int,_std::allocator<int>_>_>._M_engaged ==
            false) {
          while (uVar15 = (uint)sVar9, uVar15 != graphs_to_consider) {
            np._data.short_data[2] = 0;
            np._data.short_data[0] = 0;
            np._data.short_data[1] = 0;
            pvVar7 = std::
                     vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     ::at(targets_ndss,sVar9);
            this_00 = (optional<std::vector<int,std::allocator<int>>> *)
                      std::
                      vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(pvVar7,__n_01);
            std::optional<std::vector<int,std::allocator<int>>>::operator=
                      (this_00,(vector<int,_std::allocator<int>_> *)&np);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&np);
            SVOBitset::SVOBitset
                      (&np,(SVOBitset *)
                           ((ulong)(this->max_graphs * t + uVar15) * 0x88 +
                           *(long *)&(((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       .
                                       super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                      ._M_head_impl)->target_graph_rows).
                                     super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ));
            uVar14 = SVOBitset::find_first(&np);
            while (uVar14 != 0xffffffff) {
              SVOBitset::reset(&np,uVar14);
              pvVar7 = std::
                       vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                       ::at(targets_ndss,sVar9);
              pvVar8 = std::
                       vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                       ::at(pvVar7,__n_01);
              nt._data.short_data[0]._0_4_ =
                   *(undefined4 *)
                    (*(long *)(*(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->targets_degrees).
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              + (long)(int)uVar15 * 0x18) + (long)(int)uVar14 * 4);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        ((vector<int,_std::allocator<int>_> *)pvVar8,(int *)&nt);
              uVar14 = SVOBitset::find_first(&np);
            }
            pvVar7 = std::
                     vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     ::at(targets_ndss,sVar9);
            pvVar8 = std::
                     vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                     ::at(pvVar7,__n_01);
            uVar3 = *(undefined8 *)
                     &(pvVar8->
                      super__Optional_base<std::vector<int,_std::allocator<int>_>,_false,_false>).
                      _M_payload.
                      super__Optional_payload<std::vector<int,_std::allocator<int>_>,_true,_false,_false>
                      .super__Optional_payload_base<std::vector<int,_std::allocator<int>_>_>.
                      _M_payload._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl;
            pvVar7 = std::
                     vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     ::at(targets_ndss,sVar9);
            pvVar8 = std::
                     vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                     ::at(pvVar7,__n_01);
            std::
            __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                      (uVar3,*(pointer *)
                              ((long)&(pvVar8->
                                      super__Optional_base<std::vector<int,_std::allocator<int>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::vector<int,_std::allocator<int>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<int,_std::allocator<int>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8));
            SVOBitset::~SVOBitset(&np);
            sVar9 = (size_type)(uVar15 + 1);
          }
        }
        for (sVar9 = 0; uVar15 = 1, sVar9 != graphs_to_consider; sVar9 = sVar9 + 1) {
          while( true ) {
            __n_00 = (ulong)(uVar15 - 1);
            pvVar10 = std::
                      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ::at(patterns_ndss,sVar9);
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::at(pvVar10,__n);
            if ((ulong)((long)(pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start >> 2) <= __n_00) break;
            pvVar7 = std::
                     vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                     ::at(targets_ndss,sVar9);
            pvVar8 = std::
                     vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                     ::at(pvVar7,__n_01);
            pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                ((vector<int,_std::allocator<int>_> *)pvVar8,__n_00);
            iVar16 = *pvVar12;
            pvVar10 = std::
                      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ::at(patterns_ndss,sVar9);
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::at(pvVar10,__n);
            pvVar12 = std::vector<int,_std::allocator<int>_>::at(pvVar11,__n_00);
            if (iVar16 < *pvVar12) {
              _Var1._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl;
              if (*(long *)&((_Var1._M_head_impl)->proof).
                            super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0
                 ) {
                n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                t_remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                p_nds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                t_nds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                t_remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                t_remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                p_nds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                p_nds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                t_nds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                t_nds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                iVar16 = (int)sVar9;
                SVOBitset::SVOBitset
                          (&np,(SVOBitset *)
                               ((ulong)(this->max_graphs * p + iVar16) * 0x88 +
                               *(long *)&((_Var1._M_head_impl)->pattern_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                while (nt._data.short_data[0]._0_4_ = SVOBitset::find_first(&np),
                      nt._data.short_data[0]._0_4_ != 0xffffffff) {
                  SVOBitset::reset(&np,nt._data.short_data[0]._0_4_);
                  local_1d0._0_4_ =
                       SVOBitset::count((SVOBitset *)
                                        ((ulong)(this->max_graphs * nt._data.short_data[0]._0_4_ +
                                                iVar16) * 0x88 +
                                        *(long *)&(((this->_imp)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                        ));
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  emplace_back<unsigned_int&,unsigned_int>
                            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&p_nds
                             ,(uint *)&nt,(uint *)local_1d0);
                }
                SVOBitset::SVOBitset
                          (&nt,(SVOBitset *)
                               ((ulong)(this->max_graphs * t + iVar16) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                while (local_1d0._0_4_ = SVOBitset::find_first(&nt),
                      ppVar5 = p_nds.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                      ppVar4 = p_nds.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                      local_1d0._0_4_ != 0xffffffff) {
                  SVOBitset::reset(&nt,local_1d0._0_4_);
                  local_180._0_4_ =
                       SVOBitset::count((SVOBitset *)
                                        ((ulong)(this->max_graphs * local_1d0._0_4_ + iVar16) * 0x88
                                        + *(long *)&(((this->_imp)._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                        ));
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  emplace_back<unsigned_int&,unsigned_int>
                            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&t_nds
                             ,(uint *)local_1d0,(uint *)local_180);
                }
                if (p_nds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    p_nds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  lVar17 = (long)p_nds.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)p_nds.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                            (p_nds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             p_nds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (int)LZCOUNT(lVar17 >> 3) * 2 ^ 0x7e);
                  if (lVar17 < 0x81) {
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                              (ppVar4,ppVar5);
                  }
                  else {
                    ppVar18 = ppVar4 + 0x10;
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                              (ppVar4,ppVar18);
                    for (; ppVar18 != ppVar5; ppVar18 = ppVar18 + 1) {
                      std::
                      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__0>>
                                (ppVar18);
                    }
                  }
                }
                ppVar5 = t_nds.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                ppVar4 = t_nds.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (t_nds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    t_nds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  lVar17 = (long)t_nds.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)t_nds.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                            (t_nds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             t_nds.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (int)LZCOUNT(lVar17 >> 3) * 2 ^ 0x7e);
                  if (lVar17 < 0x81) {
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                              (ppVar4,ppVar5);
                  }
                  else {
                    ppVar18 = ppVar4 + 0x10;
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                              (ppVar4,ppVar18);
                    for (; ppVar18 != ppVar5; ppVar18 = ppVar18 + 1) {
                      std::
                      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<gss::innards::HomomorphismModel::_check_degree_compatibility(int,int,unsigned_int,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&,std::vector<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>,std::allocator<std::vector<std::optional<std::vector<int,std::allocator<int>>>,std::allocator<std::optional<std::vector<int,std::allocator<int>>>>>>>&,bool)const::__1>>
                                (ppVar18);
                    }
                  }
                }
                for (uVar14 = 0; uVar14 <= uVar15 - 1; uVar14 = uVar14 + 1) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            (&n_p,&p_nds.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].first);
                  std::vector<int,_std::allocator<int>_>::push_back
                            (&n_t,&t_nds.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].first);
                }
                for (; (ulong)uVar15 <
                       (ulong)((long)t_nds.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)t_nds.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
                    uVar15 = uVar15 + 1) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            (&t_remaining,
                             &t_nds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar15].first);
                }
                pPVar2 = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->proof).
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1d0,this,p);
                target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_180,this,t);
                Proof::incompatible_by_nds
                          (pPVar2,iVar16,(NamedVertex *)local_1d0,(NamedVertex *)local_180,&n_p,&n_t
                           ,&t_remaining);
                std::__cxx11::string::~string((string *)(local_180 + 8));
                std::__cxx11::string::~string((string *)(local_1d0 + 8));
                SVOBitset::~SVOBitset(&nt);
                SVOBitset::~SVOBitset(&np);
                std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                ~_Vector_base(&t_nds.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             );
                std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                ~_Vector_base(&p_nds.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             );
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&t_remaining.super__Vector_base<int,_std::allocator<int>_>);
                goto LAB_00125c91;
              }
              goto LAB_00125ca5;
            }
            bVar6 = degree_and_nds_are_exact
                              (((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->params,this->pattern_size,this->target_size);
            if (bVar6) {
              pvVar7 = std::
                       vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                       ::at(targets_ndss,sVar9);
              pvVar8 = std::
                       vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                       ::at(pvVar7,__n_01);
              pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                  ((vector<int,_std::allocator<int>_> *)pvVar8,__n_00);
              iVar16 = *pvVar12;
              pvVar10 = std::
                        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        ::at(patterns_ndss,sVar9);
              pvVar11 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::at(pvVar10,__n);
              pvVar12 = std::vector<int,_std::allocator<int>_>::at(pvVar11,__n_00);
              if (iVar16 == *pvVar12) goto LAB_00125775;
              goto LAB_00125ca5;
            }
LAB_00125775:
            uVar15 = uVar15 + 1;
          }
        }
      }
      return true;
    }
    lVar17 = (long)(int)uVar15 * 0x18;
    if (*(uint *)(*(long *)(*(long *)&((_Var1._M_head_impl)->patterns_degrees).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           + lVar17) + __n * 4) <=
        *(uint *)(*(long *)(*(long *)&((_Var1._M_head_impl)->targets_degrees).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           + lVar17) + __n_01 * 4)) {
      bVar6 = degree_and_nds_are_exact
                        ((_Var1._M_head_impl)->params,this->pattern_size,this->target_size);
      if ((bVar6) &&
         (_Var1._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl,
         *(int *)(*(long *)(*(long *)&((_Var1._M_head_impl)->targets_degrees).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           + lVar17) + __n_01 * 4) !=
         *(int *)(*(long *)(*(long *)&((_Var1._M_head_impl)->patterns_degrees).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           + lVar17) + __n * 4))) goto LAB_00125ca5;
      uVar15 = uVar15 + 1;
      goto LAB_001253f7;
    }
    if (*(long *)&((_Var1._M_head_impl)->proof).
                  super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      SVOBitset::SVOBitset
                (&np,(SVOBitset *)
                     ((ulong)(this->max_graphs * p + uVar15) * 0x88 +
                     *(long *)&((_Var1._M_head_impl)->pattern_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                     ));
      for (uVar14 = 0; uVar14 < this->pattern_size; uVar14 = uVar14 + 1) {
        bVar6 = SVOBitset::test(&np,uVar14);
        if (bVar6) {
          nt._data.short_data[0]._0_4_ = uVar14;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&n_p,(int *)&nt);
        }
      }
      SVOBitset::SVOBitset
                (&nt,(SVOBitset *)
                     ((ulong)(this->max_graphs * t + uVar15) * 0x88 +
                     *(long *)&(((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->target_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                     ));
      while (uVar14 = SVOBitset::find_first(&nt), uVar14 != 0xffffffff) {
        SVOBitset::reset(&nt,uVar14);
        local_1d0._0_4_ = uVar14;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&n_t,(int *)local_1d0);
      }
      pPVar2 = (((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
               ->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_1d0,this,p);
      target_vertex_for_proof_abi_cxx11_((NamedVertex *)local_180,this,t);
      Proof::incompatible_by_degrees
                (pPVar2,uVar15,(NamedVertex *)local_1d0,&n_p,(NamedVertex *)local_180,&n_t);
      std::__cxx11::string::~string((string *)(local_180 + 8));
      std::__cxx11::string::~string((string *)(local_1d0 + 8));
      SVOBitset::~SVOBitset(&nt);
      SVOBitset::~SVOBitset(&np);
LAB_00125c91:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&n_t.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&n_p.super__Vector_base<int,_std::allocator<int>_>);
    }
LAB_00125ca5:
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

auto HomomorphismModel::_check_degree_compatibility(
    int p,
    int t,
    unsigned graphs_to_consider,
    vector<vector<vector<int>>> & patterns_ndss,
    vector<vector<optional<vector<int>>>> & targets_ndss,
    bool do_not_do_nds_yet) const -> bool
{
    if (! degree_and_nds_are_preserved(_imp->params))
        return true;

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        if (target_degree(g, t) < pattern_degree(g, p)) {
            // not ok, degrees differ
            if (_imp->proof) {
                // get the actual neighbours of p and t, in their original terms
                vector<int> n_p, n_t;

                auto np = pattern_graph_row(g, p);
                for (unsigned j = 0; j < pattern_size; ++j)
                    if (np.test(j))
                        n_p.push_back(j);

                auto nt = target_graph_row(g, t);
                for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                    nt.reset(j);
                    n_t.push_back(j);
                }

                _imp->proof->incompatible_by_degrees(g, pattern_vertex_for_proof(p), n_p,
                    target_vertex_for_proof(t), n_t);
            }
            return false;
        }
        else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && target_degree(g, t) != pattern_degree(g, p)) {
            // not ok, degrees must be exactly the same
            return false;
        }
    }
    if (_imp->params.no_nds || do_not_do_nds_yet)
        return true;

    // full compare of neighbourhood degree sequences
    if (! targets_ndss.at(0).at(t)) {
        for (unsigned g = 0; g < graphs_to_consider; ++g) {
            targets_ndss.at(g).at(t) = vector<int>{};
            auto ni = target_graph_row(g, t);
            for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                ni.reset(j);
                targets_ndss.at(g).at(t)->push_back(target_degree(g, j));
            }
            sort(targets_ndss.at(g).at(t)->begin(), targets_ndss.at(g).at(t)->end(), greater<int>());
        }
    }

    for (unsigned g = 0; g < graphs_to_consider; ++g) {
        for (unsigned x = 0; x < patterns_ndss.at(g).at(p).size(); ++x) {
            if (targets_ndss.at(g).at(t)->at(x) < patterns_ndss.at(g).at(p).at(x)) {
                if (_imp->proof) {
                    vector<int> p_subsequence, t_subsequence, t_remaining;

                    // need to know the NDS together with the actual vertices
                    vector<pair<int, int>> p_nds, t_nds;

                    auto np = pattern_graph_row(g, p);
                    for (auto w = np.find_first(); w != decltype(np)::npos; w = np.find_first()) {
                        np.reset(w);
                        p_nds.emplace_back(w, pattern_graph_row(g, w).count());
                    }

                    auto nt = target_graph_row(g, t);
                    for (auto w = nt.find_first(); w != decltype(nt)::npos; w = nt.find_first()) {
                        nt.reset(w);
                        t_nds.emplace_back(w, target_graph_row(g, w).count());
                    }

                    sort(p_nds.begin(), p_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
                    sort(t_nds.begin(), t_nds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

                    for (unsigned y = 0; y <= x; ++y) {
                        p_subsequence.push_back(p_nds[y].first);
                        t_subsequence.push_back(t_nds[y].first);
                    }
                    for (unsigned y = x + 1; y < t_nds.size(); ++y)
                        t_remaining.push_back(t_nds[y].first);

                    _imp->proof->incompatible_by_nds(g, pattern_vertex_for_proof(p),
                        target_vertex_for_proof(t), p_subsequence, t_subsequence, t_remaining);
                }
                return false;
            }
            else if (degree_and_nds_are_exact(_imp->params, pattern_size, target_size) && targets_ndss.at(g).at(t)->at(x) != patterns_ndss.at(g).at(p).at(x))
                return false;
        }
    }

    return true;
}